

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O2

void __thiscall Kraken::KClient::KClient(KClient *this)

{
  EVP_PKEY_CTX *ctx;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)this,"",&local_29);
  std::__cxx11::string::string((string *)&this->secret_,"",&local_2a);
  std::__cxx11::string::string((string *)&this->url_,"https://api.kraken.com",&local_2b);
  ctx = (EVP_PKEY_CTX *)0x11b6d3;
  std::__cxx11::string::string((string *)&this->version_,"0",&local_2c);
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient() 
   :key_(""), secret_(""), url_("https://api.kraken.com"), version_("0") 
{ 
   init(); 
}